

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::updateDualSteepestEdgeWeights(HEkkPrimal *this)

{
  reference pvVar1;
  vector<double,_std::allocator<double>_> *this_00;
  HVectorBase<double> *in_RDI;
  double dVar2;
  double Kai;
  double new_pivotal_edge_weight;
  double pivot_in_scaled_space;
  vector<double,_std::allocator<double>_> *edge_weight;
  double *in_stack_00000198;
  double in_stack_000001a0;
  double in_stack_000001a8;
  HVector *in_stack_000001b0;
  HighsInt in_stack_000001b8;
  HighsInt in_stack_000001bc;
  HEkk *in_stack_000001c0;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  HEkkPrimal *in_stack_ffffffffffffffa0;
  HVector *in_stack_ffffffffffffffa8;
  HSimplexNla *in_stack_ffffffffffffffb0;
  HVectorBase<double> *in_stack_ffffffffffffffc0;
  HVectorBase<double> *in_stack_ffffffffffffffc8;
  HVector *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  HighsInt iRow;
  HSimplexNla *in_stack_ffffffffffffffe8;
  
  iRow = (HighsInt)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  HVectorBase<double>::copy<double>(in_RDI,in_stack_ffffffffffffffc8);
  updateFtranDSE(in_stack_ffffffffffffffa0,
                 (HVector *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = (vector<double,_std::allocator<double>_> *)(*(long *)in_RDI + 0x2a20);
  if ((*(byte *)(*(long *)in_RDI + 0x2a50) & 1) == 0) {
    dVar2 = HSimplexNla::rowEp2NormInScaledSpace
                      (in_stack_ffffffffffffffe8,iRow,in_stack_ffffffffffffffd8);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this_00,(long)*(int *)&(in_RDI->cwork).
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.field_0xc);
    *pvVar1 = dVar2;
  }
  else {
    dVar2 = HVectorBase<double>::norm2(in_stack_ffffffffffffffc0);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       (this_00,(long)*(int *)&(in_RDI->cwork).
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.field_0xc);
    *pvVar1 = dVar2;
  }
  dVar2 = HSimplexNla::pivotInScaledSpace
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (HighsInt)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     (HighsInt)in_stack_ffffffffffffffa0);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this_00,(long)*(int *)&(in_RDI->cwork).
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .field_0xc);
  dVar2 = *pvVar1 / (dVar2 * dVar2);
  std::vector<double,_std::allocator<double>_>::data
            ((vector<double,_std::allocator<double>_> *)0x7af253);
  HEkk::updateDualSteepestEdgeWeights
            (in_stack_000001c0,in_stack_000001bc,in_stack_000001b8,in_stack_000001b0,
             in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                     (this_00,(long)*(int *)&(in_RDI->cwork).
                                             super__Vector_base<char,_std::allocator<char>_>._M_impl
                                             .field_0xc);
  *pvVar1 = dVar2;
  return;
}

Assistant:

void HEkkPrimal::updateDualSteepestEdgeWeights() {
  col_steepest_edge.copy(&row_ep);
  updateFtranDSE(col_steepest_edge);
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  // Compute the weight from row_ep and over-write the updated weight
  if (ekk_instance_.simplex_in_scaled_space_) {
    edge_weight[row_out] = row_ep.norm2();
  } else {
    edge_weight[row_out] =
        ekk_instance_.simplex_nla_.rowEp2NormInScaledSpace(row_out, row_ep);
  }
  const double pivot_in_scaled_space =
      ekk_instance_.simplex_nla_.pivotInScaledSpace(&col_aq, variable_in,
                                                    row_out);
  if (ekk_instance_.simplex_in_scaled_space_)
    assert(pivot_in_scaled_space == alpha_col);
  const double new_pivotal_edge_weight =
      edge_weight[row_out] / (pivot_in_scaled_space * pivot_in_scaled_space);
  const double Kai = -2 / pivot_in_scaled_space;
  ekk_instance_.updateDualSteepestEdgeWeights(row_out, variable_in, &col_aq,
                                              new_pivotal_edge_weight, Kai,
                                              col_steepest_edge.array.data());
  edge_weight[row_out] = new_pivotal_edge_weight;
}